

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

cTValue * lj_meta_cache(GCtab *mt,MMS mm,GCstr *name)

{
  cTValue *mo;
  GCstr *name_local;
  MMS mm_local;
  GCtab *mt_local;
  
  mt_local = (GCtab *)lj_tab_getstr(mt,name);
  if (((cTValue *)mt_local == (cTValue *)0x0) || (*(uint64_t *)mt_local == 0xffffffffffffffff)) {
    mt->nomm = mt->nomm | (byte)(1 << ((byte)mm & 0x1f));
    mt_local = (GCtab *)0x0;
  }
  return (cTValue *)mt_local;
}

Assistant:

cTValue *lj_meta_cache(GCtab *mt, MMS mm, GCstr *name)
{
  cTValue *mo = lj_tab_getstr(mt, name);
  lj_assertX(mm <= MM_FAST, "bad metamethod %d", mm);
  if (!mo || tvisnil(mo)) {  /* No metamethod? */
    mt->nomm |= (uint8_t)(1u<<mm);  /* Set negative cache flag. */
    return NULL;
  }
  return mo;
}